

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O2

DUMBFILE * dumbfile_limit_xm(DUMBFILE *f)

{
  undefined8 *file;
  DUMBFILE *pDVar1;
  
  file = (undefined8 *)malloc(0x28);
  file[4] = f;
  *file = 0;
  file[1] = 0;
  file[2] = 0;
  file[3] = 0;
  pDVar1 = dumbfile_open_ex(file,&limit_xm_dfs);
  return pDVar1;
}

Assistant:

static DUMBFILE *dumbfile_limit_xm(DUMBFILE *f)
{
	LIMITED_XM * lx = malloc(sizeof(*lx));
	lx->remaining = f;
	lx->buffered = NULL;
	lx->ptr = 0;
	lx->limit = 0;
	lx->allocated = 0;
	return dumbfile_open_ex( lx, &limit_xm_dfs );
}